

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::RefCountersImpl::ReleaseWeakRef(RefCountersImpl *this)

{
  int iVar1;
  undefined4 uVar2;
  ObjectState OVar3;
  Char *pCVar4;
  atomic<int> *Args_1;
  undefined1 local_c8 [8];
  string msg_2;
  string msg_1;
  undefined1 local_78 [8];
  string msg;
  undefined1 local_50 [4];
  int NumWeakReferences;
  unique_lock<Threading::SpinLock> Guard;
  RefCountersImpl *this_local;
  memory_order __b;
  
  Guard._8_8_ = this;
  std::unique_lock<Threading::SpinLock>::unique_lock
            ((unique_lock<Threading::SpinLock> *)local_50,&this->m_Lock);
  Args_1 = &this->m_NumWeakReferences;
  LOCK();
  iVar1 = (Args_1->super___atomic_base<int>)._M_i;
  (Args_1->super___atomic_base<int>)._M_i = (Args_1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  msg.field_2._12_4_ = iVar1 + -1;
  if ((int)msg.field_2._12_4_ < 0) {
    FormatString<char[38]>
              ((string *)local_78,(char (*) [38])"Inconsistent call to ReleaseWeakRef()");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (atomic<int> *)0x5e;
    DebugAssertionFailed
              (pCVar4,"ReleaseWeakRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x5e);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((msg.field_2._12_4_ == 0) &&
     (OVar3 = std::atomic<Diligent::RefCountersImpl::ObjectState>::load
                        (&this->m_ObjectState,memory_order_seq_cst), OVar3 == Destroyed)) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    if ((this->m_NumStrongReferences).super___atomic_base<int>._M_i != 0) {
      FormatString<char[26],char[34]>
                ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_NumStrongReferences.load() == 0",(char (*) [34])Args_1);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ReleaseWeakRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x8a);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((this->m_ObjectWrapperBuffer[0] != 0) || (this->m_ObjectWrapperBuffer[1] != 0)) {
      FormatString<char[28]>((string *)local_c8,(char (*) [28])"Object wrapper must be null");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ReleaseWeakRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x8b);
      std::__cxx11::string::~string((string *)local_c8);
    }
    std::unique_lock<Threading::SpinLock>::unlock((unique_lock<Threading::SpinLock> *)local_50);
    SelfDestroy(this);
  }
  uVar2 = msg.field_2._12_4_;
  std::unique_lock<Threading::SpinLock>::~unique_lock((unique_lock<Threading::SpinLock> *)local_50);
  return uVar2;
}

Assistant:

inline virtual ReferenceCounterValueType ReleaseWeakRef() override final
    {
        // The method must be serialized!
        std::unique_lock<Threading::SpinLock> Guard{m_Lock};

        // It is essentially important to check the number of weak references
        // while holding the lock. Otherwise reference counters object
        // may be destroyed twice if ReleaseStrongRef() is executed by other
        // thread.
        const auto NumWeakReferences = m_NumWeakReferences.fetch_add(-1) - 1;
        VERIFY(NumWeakReferences >= 0, "Inconsistent call to ReleaseWeakRef()");

        // There are two special case when we must not destroy the ref counters object even
        // when NumWeakReferences == 0 && m_NumStrongReferences == 0 :
        //
        //             This thread             |    Another thread - ReleaseStrongRef()
        //                                     |
        // 1. Lock the object                  |
        //                                     |
        // 2. Decrement m_NumWeakReferences,   |   1. Decrement m_NumStrongReferences,
        //    m_NumWeakReferences==0           |      RefCount == 0
        //                                     |
        //                                     |   2. Start waiting for the lock to destroy
        //                                     |      the object, m_ObjectState != ObjectState::Destroyed
        // 3. Do not destroy reference         |
        //    counters, unlock                 |
        //                                     |   3. Acquire the lock,
        //                                     |      destroy the object,
        //                                     |      read m_NumWeakReferences==0
        //                                     |      destroy the reference counters
        //

        // If an exception is thrown during the object construction and there is a weak pointer to the object itself,
        // we may get to this point, but should not destroy the reference counters, because it will be destroyed by MakeNewRCObj
        // Consider this example:
        //
        //   A ==sp==> B ---wp---> A
        //
        //   MakeNewRCObj::operator()
        //    try
        //    {
        //     A.ctor()
        //       B.ctor()
        //        wp.ctor m_NumWeakReferences==1
        //        throw
        //        wp.dtor m_NumWeakReferences==0, destroy this
        //    }
        //    catch(...)
        //    {
        //       Destroy ref counters second time
        //    }
        //
        if (NumWeakReferences == 0 && /*m_NumStrongReferences == 0 &&*/ m_ObjectState.load() == ObjectState::Destroyed)
        {
            VERIFY_EXPR(m_NumStrongReferences.load() == 0);
            VERIFY(m_ObjectWrapperBuffer[0] == 0 && m_ObjectWrapperBuffer[1] == 0, "Object wrapper must be null");
            // m_ObjectState is set to ObjectState::Destroyed under the lock. If the state is not Destroyed,
            // ReleaseStrongRef() will take care of it.
            // Access to Object wrapper and decrementing m_NumWeakReferences is atomic. Since we acquired the lock,
            // no other thread can access either of them.
            // Access to m_NumStrongReferences is NOT PROTECTED by lock.

            // There are no more references to the ref counters object and the object itself
            // is already destroyed.
            // We can safely unlock it and destroy.
            // If we do not unlock it, this->m_LockFlag will expire,
            // which will cause Lock.~LockHelper() to crash.
            Guard.unlock();
            SelfDestroy();
        }
        return NumWeakReferences;
    }